

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

void __thiscall despot::EvalLog::SetInitialBudget(EvalLog *this,string *instance)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  void *this_00;
  bool bVar4;
  double dVar5;
  string local_90;
  string local_70;
  byte local_39;
  string local_38;
  string *local_18;
  string *instance_local;
  EvalLog *this_local;
  
  curr_inst_budget = 0.0;
  local_18 = instance;
  instance_local = (string *)this;
  iVar1 = GetNumRemainingRuns(this);
  local_39 = 0;
  bVar4 = false;
  if (iVar1 != 0) {
    std::__cxx11::string::string((string *)&local_38,(string *)instance);
    local_39 = 1;
    iVar1 = GetNumRemainingRuns(this,&local_38);
    bVar4 = iVar1 != 0;
  }
  if ((local_39 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  if (bVar4) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Num of remaining runs: curr / total = ");
    std::__cxx11::string::string((string *)&local_70,(string *)instance);
    iVar1 = GetNumRemainingRuns(this,&local_70);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3," / ");
    iVar1 = GetNumRemainingRuns(this);
    this_00 = (void *)std::ostream::operator<<(poVar3,iVar1);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_70);
    dVar5 = curr_inst_start_time - (double)start_time;
    iVar1 = GetNumRemainingRuns(this);
    std::__cxx11::string::string((string *)&local_90,(string *)instance);
    iVar2 = GetNumRemainingRuns(this,&local_90);
    curr_inst_budget = ((86400.0 - dVar5) / (double)iVar1) * (double)iVar2;
    std::__cxx11::string::~string((string *)&local_90);
    if (curr_inst_budget < 0.0) {
      curr_inst_budget = 0.0;
    }
    if (1080.0 < curr_inst_budget) {
      curr_inst_budget = 1080.0;
    }
  }
  return;
}

Assistant:

void EvalLog::SetInitialBudget(string instance) {
	curr_inst_budget = 0;
	if (GetNumRemainingRuns() != 0 && GetNumRemainingRuns(instance) != 0) {
		cout << "Num of remaining runs: curr / total = "
				<< GetNumRemainingRuns(instance) << " / "
				<< GetNumRemainingRuns() << endl;
		curr_inst_budget = (24 * 3600 - (curr_inst_start_time - start_time))
				/ GetNumRemainingRuns() * GetNumRemainingRuns(instance);
		if (curr_inst_budget < 0)
			curr_inst_budget = 0;
		if (curr_inst_budget > 18 * 60)
			curr_inst_budget = 18 * 60;
	}
}